

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.c
# Opt level: O2

void polynomial_mul(field_t field,polynomial_t l,polynomial_t r,polynomial_t res)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint i;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  
  memset(res.coeff,0,(ulong)(res.order + 1));
  uVar5 = 0;
  while (uVar4 = (uint)uVar5, uVar4 <= l.order) {
    if (uVar4 <= res.order) {
      uVar1 = res.order - uVar4;
      if (r.order <= res.order - uVar4) {
        uVar1 = r.order;
      }
      uVar3 = 0;
      while (uVar2 = (uint)uVar3, uVar2 <= uVar1) {
        bVar6 = 0;
        if (((ulong)l.coeff[uVar5] != 0) && (bVar6 = 0, r.coeff[uVar3] != 0)) {
          bVar6 = field.exp[(ulong)field.log[r.coeff[uVar3]] + (ulong)field.log[l.coeff[uVar5]]];
        }
        res.coeff[uVar2 + uVar4] = bVar6 ^ res.coeff[uVar2 + uVar4];
        uVar3 = (ulong)(uVar2 + 1);
      }
    }
    uVar5 = (ulong)(uVar4 + 1);
  }
  return;
}

Assistant:

void polynomial_mul(field_t field, polynomial_t l, polynomial_t r, polynomial_t res) {
    // perform an element-wise multiplication of two polynomials
    memset(res.coeff, 0, sizeof(field_element_t) * (res.order + 1));
    for (unsigned int i = 0; i <= l.order; i++) {
        if (i > res.order) {
            continue;
        }
        unsigned int j_limit = (r.order > res.order - i) ? res.order - i : r.order;
        for (unsigned int j = 0; j <= j_limit; j++) {
            // e.g. alpha^5*x * alpha^37*x^2 --> alpha^42*x^3
            res.coeff[i + j] = field_add(field, res.coeff[i + j], field_mul(field, l.coeff[i], r.coeff[j]));
        }
    }
}